

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllValues
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,TNamesDepend *a_values)

{
  size_t *psVar1;
  undefined4 uVar2;
  _List_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  _List_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  bool bVar11;
  key_type local_48;
  
  p_Var9 = (a_values->
           super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var9 != (_List_node_base *)a_values) {
    p_Var3 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var9);
    p_Var9 = p_Var3;
  }
  (a_values->
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)a_values;
  (a_values->
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)a_values;
  (a_values->
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  )._M_impl._M_node._M_size = 0;
  if (a_pKey != (char *)0x0 && a_pSection != (char *)0x0) {
    local_48.pComment = (char *)0x0;
    local_48.nOrder = 0;
    local_48.pItem = a_pSection;
    cVar7 = std::
            _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
            ::find(&(this->m_data)._M_t,&local_48);
    if ((_Rb_tree_header *)cVar7._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
      local_48.pComment = (char *)0x0;
      local_48.nOrder = 0;
      local_48.pItem = a_pKey;
      cVar8 = std::
              _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
              ::find((_Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                      *)&cVar7._M_node[1]._M_right,&local_48);
      bVar11 = cVar8._M_node != cVar7._M_node + 2;
      if (!bVar11) {
        return bVar11;
      }
      p_Var4 = cVar8._M_node[1]._M_right;
      p_Var5 = cVar8._M_node[1]._M_parent;
      uVar2 = *(undefined4 *)&cVar8._M_node[1]._M_left;
      p_Var9 = (_List_node_base *)operator_new(0x28);
      p_Var9[1]._M_next = (_List_node_base *)p_Var4;
      p_Var9[1]._M_prev = (_List_node_base *)p_Var5;
      *(undefined4 *)&p_Var9[2]._M_next = uVar2;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(a_values->
                super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (this->m_bAllowMultiKey != true) {
        return bVar11;
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(cVar8._M_node);
      while( true ) {
        if (p_Var10 == cVar7._M_node + 2) {
          return bVar11;
        }
        bVar6 = SI_GenericNoCase<char>::operator()
                          ((SI_GenericNoCase<char> *)
                           &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                            IsLess(char_const*,char_const*)::isLess,a_pKey,*(char **)(p_Var10 + 1));
        if (bVar6) break;
        p_Var4 = p_Var10[1]._M_right;
        p_Var5 = p_Var10[1]._M_parent;
        uVar2 = *(undefined4 *)&p_Var10[1]._M_left;
        p_Var9 = (_List_node_base *)operator_new(0x28);
        p_Var9[1]._M_next = (_List_node_base *)p_Var4;
        p_Var9[1]._M_prev = (_List_node_base *)p_Var5;
        *(undefined4 *)&p_Var9[2]._M_next = uVar2;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        psVar1 = &(a_values->
                  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      }
      return bVar11;
    }
  }
  return false;
}

Assistant:

bool
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::GetAllValues(
    const SI_CHAR * a_pSection,
    const SI_CHAR * a_pKey,
    TNamesDepend &  a_values
    ) const
{
    a_values.clear();

    if (!a_pSection || !a_pKey) {
        return false;
    }
    typename TSection::const_iterator iSection = m_data.find(a_pSection);
    if (iSection == m_data.end()) {
        return false;
    }
    typename TKeyVal::const_iterator iKeyVal = iSection->second.find(a_pKey);
    if (iKeyVal == iSection->second.end()) {
        return false;
    }

    // insert all values for this key
    a_values.push_back(Entry(iKeyVal->second, iKeyVal->first.pComment, iKeyVal->first.nOrder));
    if (m_bAllowMultiKey) {
        ++iKeyVal;
        while (iKeyVal != iSection->second.end() && !IsLess(a_pKey, iKeyVal->first.pItem)) {
            a_values.push_back(Entry(iKeyVal->second, iKeyVal->first.pComment, iKeyVal->first.nOrder));
            ++iKeyVal;
        }
    }

    return true;
}